

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O1

GraphicsPipelineStateCreateInfoX * __thiscall
Diligent::
PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
::AddSignature(PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
               *this,IPipelineResourceSignature *pSignature)

{
  pointer *pppIVar1;
  iterator __position;
  pointer ppIVar2;
  pointer ppIVar3;
  uint uVar4;
  char (*Args_1) [57];
  string msg;
  IPipelineResourceSignature *local_38;
  string local_30;
  
  local_38 = pSignature;
  if (pSignature == (IPipelineResourceSignature *)0x0) {
    FormatString<char[27]>(&local_30,(char (*) [27])"Signature must not be null");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"AddSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/interface/GraphicsTypesX.hpp"
               ,0x510);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    __position._M_current =
         (this->Signatures).
         super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->Signatures).
        super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Diligent::IPipelineResourceSignature*,std::allocator<Diligent::IPipelineResourceSignature*>>
      ::_M_realloc_insert<Diligent::IPipelineResourceSignature*&>
                ((vector<Diligent::IPipelineResourceSignature*,std::allocator<Diligent::IPipelineResourceSignature*>>
                  *)&this->Signatures,__position,&local_38);
    }
    else {
      *__position._M_current = pSignature;
      pppIVar1 = &(this->Signatures).
                  super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppIVar1 = *pppIVar1 + 1;
    }
    ppIVar2 = (this->Signatures).
              super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppIVar3 = (this->Signatures).
              super__Vector_base<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    (this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.ppResourceSignatures
         = ppIVar2;
    Args_1 = (char (*) [57])((ulong)((long)ppIVar3 - (long)ppIVar2) >> 3);
    uVar4 = (uint)Args_1;
    (this->super_GraphicsPipelineStateCreateInfo).super_PipelineStateCreateInfo.
    ResourceSignaturesCount = uVar4;
    if (8 < uVar4) {
      FormatString<char[26],char[57]>
                (&local_30,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"this->ResourceSignaturesCount <= MAX_RESOURCE_SIGNATURES",Args_1);
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"AddSignature",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/interface/GraphicsTypesX.hpp"
                 ,0x517);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
    ::emplace_back<Diligent::IPipelineResourceSignature*&>
              ((vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
                *)&this->Objects,&local_38);
  }
  return (GraphicsPipelineStateCreateInfoX *)this;
}

Assistant:

DerivedType& AddSignature(IPipelineResourceSignature* pSignature)
    {
        if (pSignature == nullptr)
        {
            UNEXPECTED("Signature must not be null");
            return static_cast<DerivedType&>(*this);
        }

        Signatures.emplace_back(pSignature);
        this->ppResourceSignatures    = Signatures.data();
        this->ResourceSignaturesCount = static_cast<Uint32>(Signatures.size());
        VERIFY_EXPR(this->ResourceSignaturesCount <= MAX_RESOURCE_SIGNATURES);
        Objects.emplace_back(pSignature);

        return static_cast<DerivedType&>(*this);
    }